

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::LRNParameter::set_norm_region(LRNParameter *this,LRNParameter_NormRegion value)

{
  if (value < 2) {
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
    this->norm_region_ = value;
    return;
  }
  __assert_fail("::caffe::LRNParameter_NormRegion_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                ,0x4fb1,
                "void caffe::LRNParameter::set_norm_region(::caffe::LRNParameter_NormRegion)");
}

Assistant:

bool LRNParameter_NormRegion_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}